

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.hpp
# Opt level: O2

void __thiscall rek::sample::AliasSampler::initSampler(AliasSampler *this)

{
  double dVar1;
  pointer puVar2;
  pointer puVar3;
  pointer pdVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  char *__assertion;
  ulong uVar10;
  
  uVar5 = this->N;
  if (uVar5 == 0) {
    __assertion = "1 <= N";
    uVar5 = 0x46;
  }
  else {
    puVar2 = (this->A).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (this->B).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->Y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 1;
    while( true ) {
      if (uVar5 < uVar8) {
        *puVar3 = 0;
        *pdVar4 = 0.0;
        uVar5 = this->N + 1;
        puVar3[uVar5] = uVar5;
        uVar7 = (ulong)(this->N + 1);
        pdVar4[uVar7] = 2.0;
        uVar9 = 0;
        while( true ) {
          do {
            uVar8 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar8;
            uVar5 = puVar3[uVar9];
          } while (pdVar4[uVar5] <= 1.0 && pdVar4[uVar5] != 1.0);
          do {
            uVar6 = (uint)uVar7;
            uVar7 = (ulong)(uVar6 - 1);
          } while (1.0 <= pdVar4[puVar3[uVar7]]);
          if (uVar6 - 1 <= uVar8) break;
          puVar3[uVar9] = puVar3[uVar7];
          puVar3[uVar7] = uVar5;
        }
        puVar2 = (this->A).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          uVar9 = (ulong)uVar6;
          while( true ) {
            if (uVar7 == 0) {
              return;
            }
            do {
              uVar10 = uVar9;
              uVar6 = (uint)uVar10;
              uVar5 = puVar3[uVar10];
              dVar1 = pdVar4[uVar5];
              uVar9 = (ulong)(uVar6 + 1);
            } while (dVar1 <= 1.0);
            uVar8 = puVar3[uVar7];
            if (1.0 <= pdVar4[uVar8]) {
              __assertion = "Y[B[i]] < 1.0";
              uVar5 = 0x65;
              goto LAB_0010264c;
            }
            if (this->N < uVar6) {
              return;
            }
            if (dVar1 <= 1.0) {
              __assertion = "Y[B[j]] > 1.0";
              uVar5 = 0x68;
              goto LAB_0010264c;
            }
            pdVar4[uVar5] = dVar1 + pdVar4[uVar8] + -1.0;
            puVar2[uVar8] = uVar5;
            if (1.0 < pdVar4[puVar3[uVar10]] || pdVar4[puVar3[uVar10]] == 1.0) break;
            if (uVar6 <= (uint)uVar7) {
              __assertion = "i < j";
              uVar5 = 0x6c;
              goto LAB_0010264c;
            }
            uVar5 = puVar3[uVar7];
            puVar3[uVar7] = puVar3[uVar10];
            puVar3[uVar10] = uVar5;
          }
          uVar7 = (ulong)((uint)uVar7 - 1);
        } while( true );
      }
      puVar2[uVar8] = uVar8;
      puVar3[uVar8] = uVar8;
      if (pdVar4[uVar8] < 0.0) break;
      uVar5 = this->N;
      pdVar4[uVar8] = pdVar4[uVar8] * (double)uVar5;
      uVar8 = uVar8 + 1;
    }
    __assertion = "Y[i] >= 0.0";
    uVar5 = 0x4a;
  }
LAB_0010264c:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/zouzias[P]REK-CPP/src/sampler.hpp"
                ,uVar5,"void rek::sample::AliasSampler::initSampler()");
}

Assistant:

void initSampler() {
    unsigned int i, j, k;
    assert(1 <= N);
    for (i = 1; i <= N; i++) {
      A[i] = i;
      B[i] = i; /* initial destins=stay there */
      assert(Y[i] >= 0.0);
      Y[i] = Y[i] * N; /* scale probvec */
    }
    B[0] = 0;
    Y[0] = 0.0;
    B[N + 1] = N + 1;
    Y[N + 1] = 2.0; /* sentinels */
    i = 0;
    j = N + 1;
    for (;;) {
      do {
        i++;
      } while (Y[B[i]] < 1.0); /* find i so X[B[i]] needs more */
      do {
        j--;
      } while (Y[B[j]] >= 1.0); /* find j so X[B[j]] wants less */
      if (i >= j) break;
      k = B[i];
      B[i] = B[j];
      B[j] = k; /* swap B[i], B[j] */
    }

    i = j;
    j++;
    while (i > 0) {
      while (Y[B[j]] <= 1.0) j++;
      /* find j so X[B[j]] needs more */
      assert(Y[B[i]] < 1.0); /* meanwhile X[B[i]] wants less */
      if (j > N) break;
      assert(j <= N);
      assert(Y[B[j]] > 1.0);
      Y[B[j]] -= 1.0 - Y[B[i]]; /* B[i] will donate to B[j] to fix up */
      A[B[i]] = B[j];
      if (Y[B[j]] < 1.0) { /* X[B[j]] now wants less so readjust ordering */
        assert(i < j);
        k = B[i];
        B[i] = B[j];
        B[j] = k; /* swap B[j], B[i] */
        j++;
      } else
        i--;
    }
  }